

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

vector<wasm::Type,_std::allocator<wasm::Type>_> * __thiscall
wasm::HeapType::getTypeChildren
          (vector<wasm::Type,_std::allocator<wasm::Type>_> *__return_storage_ptr__,HeapType *this)

{
  initializer_list<wasm::Type> __l;
  bool bVar1;
  HeapTypeKind HVar2;
  Type *pTVar3;
  Struct *this_00;
  Signature SVar4;
  Iterator IVar5;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar6;
  allocator<wasm::Type> local_101;
  HeapType local_100 [2];
  Type local_f0;
  iterator local_e8;
  size_type local_e0;
  reference local_d8;
  Field *field;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  FieldList *__range3_1;
  value_type local_b0;
  Type t;
  Iterator __end4;
  Iterator __begin4;
  Type *__range4;
  Type tuple;
  const_iterator __end3;
  const_iterator __begin3;
  uintptr_t local_60;
  initializer_list<wasm::Type> local_58;
  initializer_list<wasm::Type> *local_48;
  initializer_list<wasm::Type> *__range3;
  uintptr_t local_30;
  Signature sig;
  HeapType *this_local;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *children;
  
  HVar2 = getKind(this);
  switch(HVar2) {
  case Basic:
    memset(__return_storage_ptr__,0,0x18);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(__return_storage_ptr__);
    break;
  case Func:
    sig.results.id._7_1_ = 0;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(__return_storage_ptr__);
    SVar4 = getSignature(this);
    local_60 = (uintptr_t)SVar4.results.id;
    __begin3 = (const_iterator)SVar4.params.id;
    local_58._M_array = (iterator)&__begin3;
    local_58._M_len = 2;
    local_48 = &local_58;
    local_30 = (uintptr_t)__begin3;
    sig.params.id = local_60;
    __end3 = std::initializer_list<wasm::Type>::begin(local_48);
    tuple.id = (uintptr_t)std::initializer_list<wasm::Type>::end(local_48);
    for (; __end3 != (const_iterator)tuple.id; __end3 = __end3 + 1) {
      __range4 = (Type *)__end3->id;
      IVar5 = wasm::Type::begin((Type *)&__range4);
      __end4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
           (size_t)IVar5.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
      PVar6 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
              wasm::Type::end((Type *)&__range4);
      while( true ) {
        __end4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)PVar6.index;
        t.id = (uintptr_t)PVar6.parent;
        bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                          ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                           &__end4.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                                  &t);
        if (!bVar1) break;
        pTVar3 = wasm::Type::Iterator::operator*
                           ((Iterator *)
                            &__end4.
                             super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             index);
        local_b0.id = pTVar3->id;
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                  (__return_storage_ptr__,&local_b0);
        ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                  ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                   &__end4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                  );
        PVar6.index = (size_t)__end4.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent;
        PVar6.parent = (Type *)t.id;
      }
    }
    break;
  case Struct:
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(__return_storage_ptr__);
    this_00 = getStruct(this);
    __end3_1 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::begin(&this_00->fields);
    field = (Field *)std::vector<wasm::Field,_std::allocator<wasm::Field>_>::end(&this_00->fields);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
                               *)&field), bVar1) {
      local_d8 = __gnu_cxx::
                 __normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
                 ::operator*(&__end3_1);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                (__return_storage_ptr__,&local_d8->type);
      __gnu_cxx::
      __normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
      ::operator++(&__end3_1);
    }
    break;
  case Array:
    getArray(local_100);
    local_f0.id = local_100[0].id;
    local_e8 = &local_f0;
    local_e0 = 1;
    std::allocator<wasm::Type>::allocator(&local_101);
    __l._M_len = local_e0;
    __l._M_array = local_e8;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              (__return_storage_ptr__,__l,&local_101);
    std::allocator<wasm::Type>::~allocator(&local_101);
    break;
  case Cont:
    memset(__return_storage_ptr__,0,0x18);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(__return_storage_ptr__);
    break;
  default:
    handle_unreachable("unexpected kind",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                       ,0x497);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Type> HeapType::getTypeChildren() const {
  switch (getKind()) {
    case HeapTypeKind::Basic:
      return {};
    case HeapTypeKind::Func: {
      std::vector<Type> children;
      auto sig = getSignature();
      for (auto tuple : {sig.params, sig.results}) {
        for (auto t : tuple) {
          children.push_back(t);
        }
      }
      return children;
    }
    case HeapTypeKind::Struct: {
      std::vector<Type> children;
      for (auto& field : getStruct().fields) {
        children.push_back(field.type);
      }
      return children;
    }
    case HeapTypeKind::Array:
      return {getArray().element.type};
    case HeapTypeKind::Cont:
      return {};
  }
  WASM_UNREACHABLE("unexpected kind");
}